

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O0

void __thiscall Game::GameBoard::GameBoard(GameBoard *this,ull playsize)

{
  allocator<Game::tile_t> local_31;
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> local_30;
  ull local_18;
  ull playsize_local;
  GameBoard *this_local;
  
  local_18 = playsize;
  playsize_local = (ull)this;
  std::allocator<Game::tile_t>::allocator(&local_31);
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
            (&local_30,playsize * playsize,&local_31);
  GameBoard(this,playsize,&local_30);
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::~vector(&local_30);
  std::allocator<Game::tile_t>::~allocator(&local_31);
  return;
}

Assistant:

GameBoard::GameBoard(ull playsize)
    : GameBoard{playsize, tile_data_array_t(playsize * playsize)} {
}